

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O0

int If_CutPerformCheck07(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  int iVar1;
  word wVar2;
  word local_78;
  word t_2 [2];
  word z_2;
  word t_1;
  word z_1;
  word t;
  word z;
  int v;
  int fDerive;
  char *pStr_local;
  int nLeaves_local;
  int nVars_local;
  uint *pTruth_local;
  If_Man_t *p_local;
  
  z._0_4_ = 0;
  while( true ) {
    if (nLeaves <= (int)z) {
      if (nLeaves < 5) {
        p_local._4_4_ = 1;
      }
      else if (nLeaves == 5) {
        wVar2 = If_Dec5Perform(CONCAT44(*pTruth,*pTruth),0);
        p_local._4_4_ = (uint)(wVar2 != 0);
      }
      else if (nLeaves == 6) {
        wVar2 = If_Dec6Perform(*(word *)pTruth,0);
        p_local._4_4_ = (uint)(wVar2 != 0);
      }
      else {
        if (nLeaves != 7) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                        ,0x45b,
                        "int If_CutPerformCheck07(If_Man_t *, unsigned int *, int, int, char *)");
        }
        local_78 = *(word *)pTruth;
        t_2[0] = *(word *)(pTruth + 2);
        wVar2 = If_Dec7Perform(&local_78,0);
        p_local._4_4_ = (uint)(wVar2 != 0);
      }
      return p_local._4_4_;
    }
    iVar1 = Abc_TtHasVar((word *)pTruth,nVars,(int)z);
    if (iVar1 == 0) break;
    z._0_4_ = (int)z + 1;
  }
  return 0;
}

Assistant:

int If_CutPerformCheck07( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{
    int fDerive = 0;
    int v;
    // skip non-support minimal
    for ( v = 0; v < nLeaves; v++ )
        if ( !Abc_TtHasVar( (word *)pTruth, nVars, v ) )
            return 0;
    // check
    if ( nLeaves < 5 )
        return 1;
    if ( nLeaves == 5 )
    {
        word z, t = ((word)pTruth[0] << 32) | (word)pTruth[0];
        z = If_Dec5Perform( t, fDerive );
        if ( fDerive && z )
            If_Dec6Verify( t, z );
        return z != 0;
    }
    if ( nLeaves == 6 )
    {
        word z, t = ((word *)pTruth)[0];
        z = If_Dec6Perform( t, fDerive );
        if ( fDerive && z )
        {
//            If_DecPrintConfig( z );
            If_Dec6Verify( t, z );
        }
//        if ( z == 0 )
//            Extra_PrintHex(stdout, (unsigned *)&t, 6), printf( "  " ), Kit_DsdPrintFromTruth( (unsigned *)&t, 6 ), printf( "\n" );
        return z != 0;
    }
    if ( nLeaves == 7 )
    {
        word z, t[2];
        t[0] = ((word *)pTruth)[0];
        t[1] = ((word *)pTruth)[1];
//        if ( If_Dec7CheckMux(t) >= 0 )
//            return 1;
        z = If_Dec7Perform( t, fDerive );
        if ( fDerive && z )
            If_Dec7Verify( t, z );
        return z != 0;
    }
    assert( 0 );
    return 0;
}